

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::Data
          (Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> *this,
          Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> *other,
          size_t reserved)

{
  uchar *puVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *pNVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  size_t numBuckets;
  R RVar14;
  Bucket BVar15;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar3 = other->size;
  this->size = uVar3;
  if (reserved < uVar3) {
    reserved = uVar3;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserved) && (numBuckets = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar11 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar11 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar14 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar14.spans;
  uVar3 = other->numBuckets;
  if (0x7f < uVar3) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      pSVar4 = other->spans;
      lVar13 = 0;
      do {
        bVar2 = pSVar4->offsets[lVar13 + lVar11];
        if (bVar2 != 0xff) {
          pEVar5 = pSVar4[uVar12].entries;
          uVar8 = (uint)bVar2 * 0x30;
          puVar1 = (pEVar5->storage).data + uVar8;
          uVar10 = (this->seed >> 0x20 ^ this->seed ^ (ulong)*(ControlPixmap *)puVar1) *
                   -0x2917014799a6026d;
          uVar10 = (uVar10 >> 0x20 ^ uVar10) * -0x2917014799a6026d;
          BVar15 = findBucketWithHash<QPixmapStyle::ControlPixmap>
                             (this,(ControlPixmap *)((pEVar5->storage).data + uVar8),
                              uVar10 >> 0x20 ^ uVar10);
          pNVar9 = Span<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::
                   insert(BVar15.span,BVar15.index);
          pNVar9->key = *(ControlPixmap *)puVar1;
          QPixmap::QPixmap(&(pNVar9->value).pixmap,(QPixmap *)(puVar1 + 8));
          uVar6 = *(undefined8 *)(puVar1 + 0x20);
          uVar7 = *(undefined8 *)(puVar1 + 0x28);
          (pNVar9->value).margins.m_left = (Representation)(int)uVar6;
          (pNVar9->value).margins.m_top = (Representation)(int)((ulong)uVar6 >> 0x20);
          (pNVar9->value).margins.m_right = (Representation)(int)uVar7;
          (pNVar9->value).margins.m_bottom = (Representation)(int)((ulong)uVar7 >> 0x20);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x80);
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x90;
    } while (uVar12 != uVar3 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }